

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

Range<unsigned_char> __thiscall
Centaurus::CharClass<unsigned_char>::operator[](CharClass<unsigned_char> *this,int index)

{
  ulong uVar1;
  long lVar2;
  ulong in_RDX;
  undefined4 in_register_00000034;
  Range<unsigned_char> RVar3;
  Range<unsigned_char> RVar4;
  
  if (-1 < (int)in_RDX) {
    uVar1 = in_RDX & 0xffffffff;
    in_RDX = *(ulong *)(CONCAT44(in_register_00000034,index) + 8);
    if (uVar1 < (ulong)((long)(*(long *)(CONCAT44(in_register_00000034,index) + 0x10) - in_RDX) >> 4
                       )) {
      lVar2 = uVar1 * 0x10;
      this->_vptr_CharClass = (_func_int **)&PTR__Range_0019a578;
      *(undefined1 *)
       &(this->m_ranges).
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = *(undefined1 *)(in_RDX + 8 + lVar2);
      *(undefined1 *)
       ((long)&(this->m_ranges).
               super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) = *(undefined1 *)(in_RDX + 9 + lVar2);
      RVar3.m_start = (char)in_RDX;
      RVar3.m_end = (char)(in_RDX >> 8);
      RVar3._10_6_ = (int6)(in_RDX >> 0x10);
      RVar3._vptr_Range = (_func_int **)this;
      return RVar3;
    }
  }
  this->_vptr_CharClass = (_func_int **)&PTR__Range_0019a578;
  *(undefined2 *)
   &(this->m_ranges).
    super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  RVar4.m_start = (char)in_RDX;
  RVar4.m_end = (char)(in_RDX >> 8);
  RVar4._10_6_ = (int6)(in_RDX >> 0x10);
  RVar4._vptr_Range = (_func_int **)this;
  return RVar4;
}

Assistant:

Range<TCHAR> operator[](int index) const
    {
        if (index >= 0 && index < m_ranges.size())
            return m_ranges[index];
        return Range<TCHAR>();
    }